

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InprocComms.cpp
# Opt level: O0

void __thiscall helics::inproc::InprocComms::queue_tx_function(InprocComms *this)

{
  string_view name;
  string_view copyToName;
  string_view copyToName_00;
  string_view copyToName_01;
  string_view brokerName;
  string_view brokerName_00;
  string_view copyFromName;
  string_view copyFromName_00;
  string_view copyFromName_01;
  string_view message;
  string_view message_00;
  string_view message_01;
  string_view message_02;
  string_view message_03;
  string_view message_04;
  format_args args;
  string_view fmt;
  __type_conflict _Var1;
  bool bVar2;
  uint uVar3;
  element_type *peVar4;
  socklen_t sVar5;
  sockaddr *__addr;
  sockaddr *__addr_00;
  int iVar6;
  long in_RDI;
  string_view sVar7;
  pair<std::_Rb_tree_iterator<std::pair<const_helics::route_id,_std::shared_ptr<helics::BrokerBase>_>_>,_bool>
  pVar8;
  __sv_type _Var9;
  iterator rt_find;
  shared_ptr<helics::CoreBroker> cbrk;
  shared_ptr<helics::Broker> brk;
  shared_ptr<helics::CommonCore> tcore;
  shared_ptr<helics::Core> core;
  bool foundRoute;
  string_view newroute;
  bool processed;
  ActionMessage cmd;
  route_id rid;
  bool haltLoop;
  map<helics::route_id,_std::shared_ptr<helics::BrokerBase>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<helics::BrokerBase>_>_>_>
  routes;
  shared_ptr<helics::Broker> broker_1;
  milliseconds totalSleep_1;
  shared_ptr<helics::Broker> broker;
  int ecount;
  milliseconds totalSleep;
  shared_ptr<helics::CoreBroker> tbroker;
  ActionMessage *in_stack_fffffffffffff7f8;
  shared_ptr<helics::CoreBroker> *__r;
  milliseconds in_stack_fffffffffffff800;
  iterator in_stack_fffffffffffff808;
  ConnectionStatus status;
  CommsInterface *in_stack_fffffffffffff810;
  undefined4 in_stack_fffffffffffff818;
  int32_t in_stack_fffffffffffff81c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff820;
  duration<long,_std::ratio<1L,_1000L>_> *in_stack_fffffffffffff828;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff830;
  undefined7 in_stack_fffffffffffff838;
  undefined1 in_stack_fffffffffffff83f;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_stack_fffffffffffff840;
  undefined4 in_stack_fffffffffffff848;
  CoreType in_stack_fffffffffffff84c;
  undefined8 in_stack_fffffffffffff868;
  undefined4 in_stack_fffffffffffff870;
  int32_t in_stack_fffffffffffff874;
  allocator<char> *in_stack_fffffffffffff878;
  char *in_stack_fffffffffffff880;
  shared_ptr<helics::CoreBroker> local_718 [3];
  CoreType in_stack_fffffffffffff91c;
  string_view in_stack_fffffffffffff920;
  string_view in_stack_fffffffffffff930;
  _Self local_690;
  _Self local_688;
  undefined1 local_680 [32];
  char *local_660;
  undefined8 local_658;
  undefined1 local_650 [32];
  __sv_type local_630;
  undefined4 local_61c;
  BlockingPriorityQueue<std::pair<helics::route_id,_helics::ActionMessage>,_std::mutex,_std::condition_variable>
  *in_stack_fffffffffffff9e8;
  allocator<char> local_5e9 [65];
  size_t local_5a8;
  char *in_stack_fffffffffffffa60;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_stack_fffffffffffffa68;
  undefined1 in_stack_fffffffffffffa70;
  undefined1 in_stack_fffffffffffffa71 [15];
  __shared_ptr local_580 [23];
  allocator<char> local_569 [41];
  ActionMessage *command;
  __shared_ptr local_538 [16];
  _Alloc_hider local_528;
  undefined1 local_520;
  route_id local_514;
  __shared_ptr local_510 [23];
  allocator<char> local_4f9 [33];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4d8;
  __shared_ptr local_4c8 [24];
  string_view local_4b0;
  undefined4 local_4a0;
  undefined1 local_499;
  int local_3c4;
  route_id local_310;
  byte local_309;
  int local_2b4;
  duration<long,std::ratio<1l,1000l>> local_2b0 [12];
  int local_2a4;
  duration<long,std::ratio<1l,1000l>> local_2a0 [14];
  __unspec local_292;
  type local_291;
  __sv_type local_290;
  undefined8 local_278;
  undefined1 local_260 [48];
  undefined1 local_230 [15];
  __unspec local_221 [12];
  type local_215;
  int local_214;
  duration<long,std::ratio<1l,1000l>> local_210 [12];
  int local_204;
  duration<long,std::ratio<1l,1000l>> local_200 [12];
  int local_1f4;
  duration<long,std::ratio<1l,1000l>> local_1f0 [72];
  __sv_type local_1a8;
  int local_194;
  duration<long,std::ratio<1l,1000l>> local_190 [12];
  int local_184;
  duration<long,std::ratio<1l,1000l>> local_180 [8];
  int local_178;
  __unspec local_172;
  type local_171;
  __sv_type local_170;
  __sv_type local_160;
  undefined1 local_140 [32];
  __sv_type local_120;
  int local_fc;
  undefined1 local_f8 [24];
  __shared_ptr local_e0 [16];
  __sv_type local_d0;
  __sv_type local_c0;
  __sv_type local_b0;
  __sv_type local_a0;
  __sv_type local_90;
  __sv_type local_80;
  undefined1 local_68 [16];
  undefined8 local_58;
  undefined1 *local_50;
  char *local_48;
  undefined8 uStack_40;
  undefined1 *local_30;
  char *local_28;
  undefined8 uStack_20;
  undefined1 *local_18;
  undefined1 *local_10;
  undefined8 *local_8;
  
  _Var1 = std::operator==(in_stack_fffffffffffff820,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT44(in_stack_fffffffffffff81c,in_stack_fffffffffffff818));
  if (((_Var1 ^ 0xffU) & 1) != 0) {
    bVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x398b04);
    if (bVar2) {
      local_c0 = std::__cxx11::string::operator_cast_to_basic_string_view
                           ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffff800.__r);
      local_d0 = std::__cxx11::string::operator_cast_to_basic_string_view
                           ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffff800.__r);
      copyFromName_01._M_str = in_stack_fffffffffffff880;
      copyFromName_01._M_len = (size_t)in_stack_fffffffffffff878;
      copyToName_01._M_str._0_4_ = in_stack_fffffffffffff870;
      copyToName_01._M_len = in_stack_fffffffffffff868;
      copyToName_01._M_str._4_4_ = in_stack_fffffffffffff874;
      bVar2 = BrokerFactory::copyBrokerIdentifier(copyFromName_01,copyToName_01);
      if (!bVar2) {
        CommsInterface::setRxStatus
                  (in_stack_fffffffffffff810,
                   (ConnectionStatus)((ulong)in_stack_fffffffffffff808._M_node >> 0x20));
        CommsInterface::setTxStatus
                  (in_stack_fffffffffffff810,
                   (ConnectionStatus)((ulong)in_stack_fffffffffffff808._M_node >> 0x20));
        return;
      }
    }
    else {
      local_80 = std::__cxx11::string::operator_cast_to_basic_string_view
                           ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffff800.__r);
      local_90 = std::__cxx11::string::operator_cast_to_basic_string_view
                           ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffff800.__r);
      copyFromName._M_str = in_stack_fffffffffffff880;
      copyFromName._M_len = (size_t)in_stack_fffffffffffff878;
      copyToName._M_str._0_4_ = in_stack_fffffffffffff870;
      copyToName._M_len = in_stack_fffffffffffff868;
      copyToName._M_str._4_4_ = in_stack_fffffffffffff874;
      bVar2 = CoreFactory::copyCoreIdentifier(copyFromName,copyToName);
      if (!bVar2) {
        local_a0 = std::__cxx11::string::operator_cast_to_basic_string_view
                             ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffff800.__r);
        local_b0 = std::__cxx11::string::operator_cast_to_basic_string_view
                             ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffff800.__r);
        copyFromName_00._M_str = in_stack_fffffffffffff880;
        copyFromName_00._M_len = (size_t)in_stack_fffffffffffff878;
        copyToName_00._M_str._0_4_ = in_stack_fffffffffffff870;
        copyToName_00._M_len = in_stack_fffffffffffff868;
        copyToName_00._M_str._4_4_ = in_stack_fffffffffffff874;
        bVar2 = BrokerFactory::copyBrokerIdentifier(copyFromName_00,copyToName_00);
        if (!bVar2) {
          CommsInterface::setRxStatus
                    (in_stack_fffffffffffff810,
                     (ConnectionStatus)((ulong)in_stack_fffffffffffff808._M_node >> 0x20));
          CommsInterface::setTxStatus
                    (in_stack_fffffffffffff810,
                     (ConnectionStatus)((ulong)in_stack_fffffffffffff808._M_node >> 0x20));
          return;
        }
      }
    }
  }
  CommsInterface::setRxStatus
            (in_stack_fffffffffffff810,
             (ConnectionStatus)((ulong)in_stack_fffffffffffff808._M_node >> 0x20));
  std::shared_ptr<helics::CoreBroker>::shared_ptr((shared_ptr<helics::CoreBroker> *)0x398cdc);
  bVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x398cf0);
  if ((bVar2) &&
     (bVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x398d0a),
     !bVar2)) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff800.__r,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff7f8);
  }
  bVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x398d5f);
  if (bVar2) {
    if ((*(byte *)(in_RDI + 0x25b) & 1) == 0) {
      memset(local_230,0,8);
      do {
        bVar2 = std::__shared_ptr::operator_cast_to_bool(local_e0);
        if (((bVar2 ^ 0xffU) & 1) == 0) goto LAB_0039966c;
        BrokerFactory::findJoinableBrokerOfType(in_stack_fffffffffffff84c);
        std::dynamic_pointer_cast<helics::CoreBroker,helics::Broker>
                  ((shared_ptr<helics::Broker> *)
                   CONCAT44(in_stack_fffffffffffff81c,in_stack_fffffffffffff818));
        std::shared_ptr<helics::CoreBroker>::operator=
                  ((shared_ptr<helics::CoreBroker> *)in_stack_fffffffffffff800.__r,
                   (shared_ptr<helics::CoreBroker> *)in_stack_fffffffffffff7f8);
        std::shared_ptr<helics::CoreBroker>::~shared_ptr((shared_ptr<helics::CoreBroker> *)0x39940c)
        ;
        bVar2 = std::__shared_ptr::operator_cast_to_bool(local_e0);
        if (bVar2) {
LAB_0039963a:
          local_178 = 0;
        }
        else {
          if ((*(byte *)(in_RDI + 0x25c) & 1) != 0) {
            CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff810
                       ,(char *)in_stack_fffffffffffff808._M_node);
            local_290 = std::__cxx11::string::operator_cast_to_basic_string_view
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)in_stack_fffffffffffff800.__r);
            sVar5 = (socklen_t)local_278;
            BrokerFactory::create
                      (in_stack_fffffffffffff91c,in_stack_fffffffffffff930,in_stack_fffffffffffff920
                      );
            std::static_pointer_cast<helics::CoreBroker,helics::Broker>
                      ((shared_ptr<helics::Broker> *)in_stack_fffffffffffff808._M_node);
            iVar6 = (int)local_260;
            std::shared_ptr<helics::CoreBroker>::operator=
                      ((shared_ptr<helics::CoreBroker> *)in_stack_fffffffffffff800.__r,
                       (shared_ptr<helics::CoreBroker> *)in_stack_fffffffffffff7f8);
            std::shared_ptr<helics::CoreBroker>::~shared_ptr
                      ((shared_ptr<helics::CoreBroker> *)0x3994f1);
            std::shared_ptr<helics::Broker>::~shared_ptr((shared_ptr<helics::Broker> *)0x3994fe);
            peVar4 = std::
                     __shared_ptr_access<helics::CoreBroker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<helics::CoreBroker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)0x39950b);
            CoreBroker::connect(peVar4,iVar6,__addr_00,sVar5);
            goto LAB_0039963a;
          }
          local_291 = (type)std::chrono::
                            operator<=><long,_std::ratio<1L,_1000L>,_long,_std::ratio<1L,_1000L>_>
                                      (in_stack_fffffffffffff828,
                                       (duration<long,_std::ratio<1L,_1000L>_> *)
                                       in_stack_fffffffffffff820);
          CLI::std::__cmp_cat::__unspec::__unspec(&local_292,(__unspec *)0x0);
          bVar2 = std::operator>(local_291);
          if (!bVar2) {
            local_2a4 = 200;
            std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
                      (local_2a0,&local_2a4);
            std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
                      ((duration<long,_std::ratio<1L,_1000L>_> *)in_stack_fffffffffffff840.values_);
            local_2b4 = 200;
            std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
                      (local_2b0,&local_2b4);
            std::chrono::duration<long,_std::ratio<1L,_1000L>_>::operator+=
                      ((duration<long,_std::ratio<1L,_1000L>_> *)in_stack_fffffffffffff800.__r,
                       (duration<long,_std::ratio<1L,_1000L>_> *)in_stack_fffffffffffff7f8);
            goto LAB_0039963a;
          }
          CommsInterface::setTxStatus
                    (in_stack_fffffffffffff810,
                     (ConnectionStatus)((ulong)in_stack_fffffffffffff808._M_node >> 0x20));
          CommsInterface::setRxStatus
                    (in_stack_fffffffffffff810,
                     (ConnectionStatus)((ulong)in_stack_fffffffffffff808._M_node >> 0x20));
          local_178 = 1;
        }
        std::shared_ptr<helics::Broker>::~shared_ptr((shared_ptr<helics::Broker> *)0x399652);
      } while (local_178 == 0);
    }
    else {
LAB_0039966c:
      bVar2 = std::__shared_ptr::operator_cast_to_bool(local_e0);
      if (bVar2) {
        peVar4 = std::
                 __shared_ptr_access<helics::CoreBroker,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<helics::CoreBroker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x39968f);
        CoreBroker::getIdentifier_abi_cxx11_(peVar4);
        _Var1 = std::operator==(in_stack_fffffffffffff820,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT44(in_stack_fffffffffffff81c,in_stack_fffffffffffff818));
        if (_Var1) {
          CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff810,
                     (char *)in_stack_fffffffffffff808._M_node);
          message_00._M_str = in_stack_fffffffffffff880;
          message_00._M_len = (size_t)in_stack_fffffffffffff878;
          CommsInterface::logError
                    ((CommsInterface *)CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870)
                     ,message_00);
        }
        peVar4 = std::
                 __shared_ptr_access<helics::CoreBroker,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<helics::CoreBroker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x399705);
        uVar3 = (*(peVar4->super_Broker)._vptr_Broker[7])();
        if (((uVar3 & 1) == 0) && ((*(byte *)(in_RDI + 0x25e) & 1) == 0)) {
          CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff810,
                     (char *)in_stack_fffffffffffff808._M_node);
          message_01._M_str = in_stack_fffffffffffff880;
          message_01._M_len = (size_t)in_stack_fffffffffffff878;
          CommsInterface::logError
                    ((CommsInterface *)CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870)
                     ,message_01);
        }
      }
      CommsInterface::setTxStatus
                (in_stack_fffffffffffff810,
                 (ConnectionStatus)((ulong)in_stack_fffffffffffff808._M_node >> 0x20));
      std::
      map<helics::route_id,_std::shared_ptr<helics::BrokerBase>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<helics::BrokerBase>_>_>_>
      ::map((map<helics::route_id,_std::shared_ptr<helics::BrokerBase>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<helics::BrokerBase>_>_>_>
             *)0x39978d);
      local_309 = 0;
      while (((local_309 ^ 0xff) & 1) != 0) {
        route_id::route_id(&local_310);
        ActionMessage::ActionMessage((ActionMessage *)in_stack_fffffffffffff810);
        gmlc::containers::
        BlockingPriorityQueue<std::pair<helics::route_id,_helics::ActionMessage>,_std::mutex,_std::condition_variable>
        ::pop(in_stack_fffffffffffff9e8);
        std::tie<helics::route_id,helics::ActionMessage>
                  ((route_id *)in_stack_fffffffffffff808._M_node,
                   (ActionMessage *)in_stack_fffffffffffff800.__r);
        std::tuple<helics::route_id&,helics::ActionMessage&>::operator=
                  ((tuple<helics::route_id_&,_helics::ActionMessage_&> *)in_stack_fffffffffffff810,
                   (pair<helics::route_id,_helics::ActionMessage> *)
                   in_stack_fffffffffffff808._M_node);
        std::pair<helics::route_id,_helics::ActionMessage>::~pair
                  ((pair<helics::route_id,_helics::ActionMessage> *)0x39981e);
        local_499 = 0;
        bVar2 = isProtocolCommand((ActionMessage *)in_stack_fffffffffffff800.__r);
        if (bVar2) {
          local_4a0 = 0xffffffff;
          bVar2 = route_id::operator==(&local_310,(route_id)0xffffffff);
          if (!bVar2) goto LAB_00399eee;
          if (local_3c4 == 0xe9) {
            sVar7 = SmallBuffer::to_string((SmallBuffer *)0x3998e2);
            in_stack_fffffffffffff880 = sVar7._M_str;
            local_4c8[0x17] = (__shared_ptr)0x0;
            in_stack_fffffffffffff878 = local_4f9;
            local_4b0 = sVar7;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff840.values_,
                       (basic_string_view<char,_std::char_traits<char>_> *)
                       CONCAT17(in_stack_fffffffffffff83f,in_stack_fffffffffffff838),
                       (allocator<char> *)in_stack_fffffffffffff830);
            local_4d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         )std::__cxx11::string::operator_cast_to_basic_string_view
                                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)in_stack_fffffffffffff800.__r);
            name._M_str._0_4_ = in_stack_fffffffffffff848;
            name._M_len = (size_t)in_stack_fffffffffffff840.values_;
            name._M_str._4_4_ = in_stack_fffffffffffff84c;
            CoreFactory::findCore(name);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff800.__r);
            std::allocator<char>::~allocator(local_4f9);
            bVar2 = std::__shared_ptr::operator_cast_to_bool(local_4c8);
            if (bVar2) {
              std::dynamic_pointer_cast<helics::CommonCore,helics::Core>
                        ((shared_ptr<helics::Core> *)
                         CONCAT44(in_stack_fffffffffffff81c,in_stack_fffffffffffff818));
              bVar2 = std::__shared_ptr::operator_cast_to_bool(local_510);
              if (bVar2) {
                in_stack_fffffffffffff874 = ActionMessage::getExtraData((ActionMessage *)0x3999f4);
                route_id::route_id(&local_514,in_stack_fffffffffffff874);
                pVar8 = std::
                        map<helics::route_id,std::shared_ptr<helics::BrokerBase>,std::less<helics::route_id>,std::allocator<std::pair<helics::route_id_const,std::shared_ptr<helics::BrokerBase>>>>
                        ::emplace<helics::route_id,std::shared_ptr<helics::CommonCore>>
                                  ((map<helics::route_id,_std::shared_ptr<helics::BrokerBase>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<helics::BrokerBase>_>_>_>
                                    *)in_stack_fffffffffffff810,
                                   (route_id *)in_stack_fffffffffffff808._M_node,
                                   (shared_ptr<helics::CommonCore> *)in_stack_fffffffffffff800.__r);
                local_528._M_p = (pointer)pVar8.first._M_node;
                local_520 = pVar8.second;
                local_4c8[0x17] = (__shared_ptr)0x1;
              }
              std::shared_ptr<helics::CommonCore>::~shared_ptr
                        ((shared_ptr<helics::CommonCore> *)0x399ad3);
            }
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff840.values_,
                       (basic_string_view<char,_std::char_traits<char>_> *)
                       CONCAT17(in_stack_fffffffffffff83f,in_stack_fffffffffffff838),
                       (allocator<char> *)in_stack_fffffffffffff830);
            join_0x00000010_0x00000000_ =
                 std::__cxx11::string::operator_cast_to_basic_string_view
                           ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffff800.__r);
            brokerName_00._M_len._4_4_ = in_stack_fffffffffffff874;
            brokerName_00._M_len._0_4_ = in_stack_fffffffffffff870;
            brokerName_00._M_str = (char *)in_stack_fffffffffffff878;
            BrokerFactory::findBroker(brokerName_00);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff800.__r);
            std::allocator<char>::~allocator(local_569);
            bVar2 = std::__shared_ptr::operator_cast_to_bool(local_538);
            if (bVar2) {
              std::dynamic_pointer_cast<helics::CoreBroker,helics::Broker>
                        ((shared_ptr<helics::Broker> *)
                         CONCAT44(in_stack_fffffffffffff81c,in_stack_fffffffffffff818));
              bVar2 = std::__shared_ptr::operator_cast_to_bool(local_580);
              if (bVar2) {
                in_stack_fffffffffffff84c = ActionMessage::getExtraData((ActionMessage *)0x399ba5);
                in_stack_fffffffffffff830 =
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &stack0xfffffffffffffa7c;
                route_id::route_id((route_id *)in_stack_fffffffffffff830,in_stack_fffffffffffff84c);
                pVar8 = std::
                        map<helics::route_id,std::shared_ptr<helics::BrokerBase>,std::less<helics::route_id>,std::allocator<std::pair<helics::route_id_const,std::shared_ptr<helics::BrokerBase>>>>
                        ::emplace<helics::route_id,std::shared_ptr<helics::CoreBroker>>
                                  ((map<helics::route_id,_std::shared_ptr<helics::BrokerBase>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<helics::BrokerBase>_>_>_>
                                    *)in_stack_fffffffffffff810,
                                   (route_id *)in_stack_fffffffffffff808._M_node,
                                   (shared_ptr<helics::CoreBroker> *)in_stack_fffffffffffff800.__r);
                in_stack_fffffffffffff840 =
                     (anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2)
                     pVar8.first._M_node;
                in_stack_fffffffffffff83f = pVar8.second;
                local_4c8[0x17] = (__shared_ptr)0x1;
                in_stack_fffffffffffffa68 = in_stack_fffffffffffff840;
                in_stack_fffffffffffffa70 = in_stack_fffffffffffff83f;
              }
              std::shared_ptr<helics::CoreBroker>::~shared_ptr
                        ((shared_ptr<helics::CoreBroker> *)0x399c84);
            }
            if (((byte)local_4c8[0x17] & 1) == 0) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffff840.values_,
                         (char *)CONCAT17(in_stack_fffffffffffff83f,in_stack_fffffffffffff838),
                         (allocator<char> *)in_stack_fffffffffffff830);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffff840.values_,
                         (basic_string_view<char,_std::char_traits<char>_> *)
                         CONCAT17(in_stack_fffffffffffff83f,in_stack_fffffffffffff838),
                         (allocator<char> *)in_stack_fffffffffffff830);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT17(in_stack_fffffffffffff83f,in_stack_fffffffffffff838),
                             in_stack_fffffffffffff830);
              _Var9 = std::__cxx11::string::operator_cast_to_basic_string_view
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffff800.__r);
              local_5a8 = _Var9._M_len;
              in_stack_fffffffffffffa60 = _Var9._M_str;
              message_02._M_str = in_stack_fffffffffffff880;
              message_02._M_len = (size_t)in_stack_fffffffffffff878;
              CommsInterface::logError
                        ((CommsInterface *)
                         CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870),message_02);
              std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffff800.__r);
              std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffff800.__r);
              std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff9ef);
              std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffff800.__r);
              std::allocator<char>::~allocator(local_5e9);
            }
            local_499 = 1;
            std::shared_ptr<helics::Broker>::~shared_ptr((shared_ptr<helics::Broker> *)0x399e3c);
            std::shared_ptr<helics::Core>::~shared_ptr((shared_ptr<helics::Core> *)0x399e49);
            goto LAB_00399eee;
          }
          if (local_3c4 == 0xf4) {
            in_stack_fffffffffffff81c = ActionMessage::getExtraData((ActionMessage *)0x399e7a);
            in_stack_fffffffffffff810 = (CommsInterface *)&stack0xfffffffffffff9e8;
            route_id::route_id((route_id *)in_stack_fffffffffffff810,in_stack_fffffffffffff81c);
            std::
            map<helics::route_id,_std::shared_ptr<helics::BrokerBase>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<helics::BrokerBase>_>_>_>
            ::erase((map<helics::route_id,_std::shared_ptr<helics::BrokerBase>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<helics::BrokerBase>_>_>_>
                     *)in_stack_fffffffffffff800.__r,(key_type *)in_stack_fffffffffffff7f8);
            local_499 = 1;
            goto LAB_00399eee;
          }
          if (local_3c4 != 0x9db) {
            if (local_3c4 == 0x16570bf) {
              CommsInterface::setRxStatus
                        (in_stack_fffffffffffff810,
                         (ConnectionStatus)((ulong)in_stack_fffffffffffff808._M_node >> 0x20));
              local_499 = 1;
            }
            goto LAB_00399eee;
          }
          local_309 = 1;
          local_178 = 6;
        }
        else {
LAB_00399eee:
          if ((local_499 & 1) == 0) {
            local_61c = 0;
            bVar2 = route_id::operator==(&local_310,(route_id)0x0);
            if (bVar2) {
              bVar2 = std::__shared_ptr::operator_cast_to_bool(local_e0);
              if (bVar2) {
                std::
                __shared_ptr_access<helics::CoreBroker,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<helics::CoreBroker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x399f52);
                BrokerBase::addActionMessage
                          ((BrokerBase *)in_stack_fffffffffffff800.__r,in_stack_fffffffffffff7f8);
              }
              else {
                local_660 = 
                "message directed to broker of comm system with no broker, message dropped {}";
                local_658 = 0x4c;
                prettyPrintString_abi_cxx11_(command);
                local_18 = local_650;
                local_28 = local_660;
                uStack_20 = local_658;
                local_30 = local_680;
                local_48 = local_660;
                uStack_40 = local_658;
                ::fmt::v11::detail::value<fmt::v11::context>::
                value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                          ((value<fmt::v11::context> *)in_stack_fffffffffffff810,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffff808._M_node);
                local_8 = &local_58;
                local_10 = local_68;
                local_58 = 0xd;
                fmt._1_15_ = in_stack_fffffffffffffa71;
                fmt.data_._0_1_ = in_stack_fffffffffffffa70;
                args.field_1.values_ = in_stack_fffffffffffffa68.values_;
                args.desc_ = (unsigned_long_long)in_stack_fffffffffffffa60;
                local_50 = local_10;
                ::fmt::v11::vformat_abi_cxx11_(fmt,args);
                local_630 = std::__cxx11::string::operator_cast_to_basic_string_view
                                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_fffffffffffff800.__r);
                message_03._M_str = in_stack_fffffffffffff880;
                message_03._M_len = (size_t)in_stack_fffffffffffff878;
                CommsInterface::logWarning
                          ((CommsInterface *)
                           CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870),message_03)
                ;
                std::__cxx11::string::~string
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffff800.__r);
                std::__cxx11::string::~string
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffff800.__r);
              }
            }
            else {
              in_stack_fffffffffffff808 =
                   std::
                   map<helics::route_id,_std::shared_ptr<helics::BrokerBase>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<helics::BrokerBase>_>_>_>
                   ::find((map<helics::route_id,_std::shared_ptr<helics::BrokerBase>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<helics::BrokerBase>_>_>_>
                           *)in_stack_fffffffffffff7f8,(key_type *)0x39a12d);
              local_688._M_node = in_stack_fffffffffffff808._M_node;
              local_690._M_node =
                   (_Base_ptr)
                   std::
                   map<helics::route_id,_std::shared_ptr<helics::BrokerBase>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<helics::BrokerBase>_>_>_>
                   ::end((map<helics::route_id,_std::shared_ptr<helics::BrokerBase>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<helics::BrokerBase>_>_>_>
                          *)in_stack_fffffffffffff7f8);
              bVar2 = std::operator==(&local_688,&local_690);
              if (((bVar2 ^ 0xffU) & 1) == 0) {
                bVar2 = std::__shared_ptr::operator_cast_to_bool(local_e0);
                if (bVar2) {
                  std::
                  __shared_ptr_access<helics::CoreBroker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<helics::CoreBroker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x39a1c3);
                  BrokerBase::addActionMessage
                            ((BrokerBase *)in_stack_fffffffffffff800.__r,in_stack_fffffffffffff7f8);
                }
                else {
                  bVar2 = isIgnoreableCommand(in_stack_fffffffffffff7f8);
                  if (!bVar2) {
                    in_stack_fffffffffffff800.__r = (rep)&stack0xfffffffffffff91f;
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffff840.values_,
                               (char *)CONCAT17(in_stack_fffffffffffff83f,in_stack_fffffffffffff838)
                               ,(allocator<char> *)in_stack_fffffffffffff830);
                    prettyPrintString_abi_cxx11_(command);
                    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)CONCAT17(in_stack_fffffffffffff83f,in_stack_fffffffffffff838),
                                   in_stack_fffffffffffff830);
                    std::__cxx11::string::operator_cast_to_basic_string_view
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffff800.__r);
                    message_04._M_str = in_stack_fffffffffffff880;
                    message_04._M_len = (size_t)in_stack_fffffffffffff878;
                    CommsInterface::logWarning
                              ((CommsInterface *)
                               CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870),
                               message_04);
                    std::__cxx11::string::~string
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffff800.__r);
                    std::__cxx11::string::~string
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffff800.__r);
                    std::__cxx11::string::~string
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffff800.__r);
                    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff91f);
                  }
                }
              }
              else {
                std::
                _Rb_tree_iterator<std::pair<const_helics::route_id,_std::shared_ptr<helics::BrokerBase>_>_>
                ::operator->((_Rb_tree_iterator<std::pair<const_helics::route_id,_std::shared_ptr<helics::BrokerBase>_>_>
                              *)0x39a180);
                std::
                __shared_ptr_access<helics::BrokerBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<helics::BrokerBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x39a18c);
                BrokerBase::addActionMessage
                          ((BrokerBase *)in_stack_fffffffffffff800.__r,in_stack_fffffffffffff7f8);
              }
            }
            local_178 = 0;
          }
          else {
            local_178 = 6;
          }
        }
        ActionMessage::~ActionMessage((ActionMessage *)in_stack_fffffffffffff800.__r);
      }
      std::
      map<helics::route_id,_std::shared_ptr<helics::BrokerBase>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<helics::BrokerBase>_>_>_>
      ::clear((map<helics::route_id,_std::shared_ptr<helics::BrokerBase>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<helics::BrokerBase>_>_>_>
               *)0x39a3ab);
      status = (ConnectionStatus)((ulong)in_stack_fffffffffffff808._M_node >> 0x20);
      __r = local_718;
      std::shared_ptr<helics::CoreBroker>::shared_ptr
                ((shared_ptr<helics::CoreBroker> *)in_stack_fffffffffffff800.__r,__r);
      std::shared_ptr<helics::CoreBroker>::operator=
                ((shared_ptr<helics::CoreBroker> *)in_stack_fffffffffffff800.__r,__r);
      std::shared_ptr<helics::CoreBroker>::~shared_ptr((shared_ptr<helics::CoreBroker> *)0x39a3da);
      CommsInterface::setTxStatus(in_stack_fffffffffffff810,status);
      std::
      map<helics::route_id,_std::shared_ptr<helics::BrokerBase>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<helics::BrokerBase>_>_>_>
      ::~map((map<helics::route_id,_std::shared_ptr<helics::BrokerBase>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_std::shared_ptr<helics::BrokerBase>_>_>_>
              *)0x39a3fb);
      local_178 = 0;
    }
  }
  else {
    memset(local_f8,0,8);
    local_fc = 0;
    do {
      bVar2 = std::__shared_ptr::operator_cast_to_bool(local_e0);
      if (((bVar2 ^ 0xffU) & 1) == 0) goto LAB_0039966c;
      local_120 = std::__cxx11::string::operator_cast_to_basic_string_view
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffff800.__r);
      brokerName._M_len._4_4_ = in_stack_fffffffffffff874;
      brokerName._M_len._0_4_ = in_stack_fffffffffffff870;
      brokerName._M_str = (char *)in_stack_fffffffffffff878;
      BrokerFactory::findBroker(brokerName);
      std::dynamic_pointer_cast<helics::CoreBroker,helics::Broker>
                ((shared_ptr<helics::Broker> *)
                 CONCAT44(in_stack_fffffffffffff81c,in_stack_fffffffffffff818));
      std::shared_ptr<helics::CoreBroker>::operator=
                ((shared_ptr<helics::CoreBroker> *)in_stack_fffffffffffff800.__r,
                 (shared_ptr<helics::CoreBroker> *)in_stack_fffffffffffff7f8);
      std::shared_ptr<helics::CoreBroker>::~shared_ptr((shared_ptr<helics::CoreBroker> *)0x398e18);
      bVar2 = std::__shared_ptr::operator_cast_to_bool(local_e0);
      if (bVar2) {
        peVar4 = std::
                 __shared_ptr_access<helics::CoreBroker,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<helics::CoreBroker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x39905c);
        uVar3 = (*(peVar4->super_Broker)._vptr_Broker[7])();
        if (((uVar3 & 1) != 0) || ((*(byte *)(in_RDI + 0x25e) & 1) != 0)) goto LAB_0039933b;
        local_fc = local_fc + 1;
        if (local_fc == 1) {
          std::operator+((char *)CONCAT44(in_stack_fffffffffffff84c,in_stack_fffffffffffff848),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffff840.values_);
          local_1a8 = std::__cxx11::string::operator_cast_to_basic_string_view
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffff800.__r);
          message._M_str = in_stack_fffffffffffff880;
          message._M_len = (size_t)in_stack_fffffffffffff878;
          CommsInterface::logError
                    ((CommsInterface *)CONCAT44(in_stack_fffffffffffff874,in_stack_fffffffffffff870)
                     ,message);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff800.__r);
        }
        std::shared_ptr<helics::CoreBroker>::shared_ptr
                  ((shared_ptr<helics::CoreBroker> *)in_stack_fffffffffffff800.__r,
                   in_stack_fffffffffffff7f8);
        std::shared_ptr<helics::CoreBroker>::operator=
                  ((shared_ptr<helics::CoreBroker> *)in_stack_fffffffffffff800.__r,
                   (shared_ptr<helics::CoreBroker> *)in_stack_fffffffffffff7f8);
        std::shared_ptr<helics::CoreBroker>::~shared_ptr((shared_ptr<helics::CoreBroker> *)0x39917f)
        ;
        std::shared_ptr<helics::Broker>::shared_ptr
                  ((shared_ptr<helics::Broker> *)in_stack_fffffffffffff800.__r,
                   in_stack_fffffffffffff7f8);
        std::shared_ptr<helics::Broker>::operator=
                  ((shared_ptr<helics::Broker> *)in_stack_fffffffffffff800.__r,
                   (shared_ptr<helics::Broker> *)in_stack_fffffffffffff7f8);
        std::shared_ptr<helics::Broker>::~shared_ptr((shared_ptr<helics::Broker> *)0x3991b2);
        if (local_fc < 3) {
          if (local_fc == 1) {
            local_1f4 = 200;
            std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
                      (local_1f0,&local_1f4);
            std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
                      ((duration<long,_std::ratio<1L,_1000L>_> *)in_stack_fffffffffffff840.values_);
          }
          local_204 = 200;
          std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>(local_200,&local_204)
          ;
          BrokerFactory::cleanUpBrokers(in_stack_fffffffffffff800);
          local_214 = 200;
          std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>(local_210,&local_214)
          ;
          std::chrono::duration<long,_std::ratio<1L,_1000L>_>::operator+=
                    ((duration<long,_std::ratio<1L,_1000L>_> *)in_stack_fffffffffffff800.__r,
                     (duration<long,_std::ratio<1L,_1000L>_> *)in_stack_fffffffffffff7f8);
          local_221._1_8_ = *(undefined8 *)(in_RDI + 0x260);
          local_215 = (type)std::chrono::
                            operator<=><long,_std::ratio<1L,_1000L>,_long,_std::ratio<1L,_1000L>_>
                                      (in_stack_fffffffffffff828,
                                       (duration<long,_std::ratio<1L,_1000L>_> *)
                                       in_stack_fffffffffffff820);
          CLI::std::__cmp_cat::__unspec::__unspec(local_221,(__unspec *)0x0);
          bVar2 = std::operator>(local_215);
          if (!bVar2) goto LAB_0039933b;
          CommsInterface::setTxStatus
                    (in_stack_fffffffffffff810,
                     (ConnectionStatus)((ulong)in_stack_fffffffffffff808._M_node >> 0x20));
          CommsInterface::setRxStatus
                    (in_stack_fffffffffffff810,
                     (ConnectionStatus)((ulong)in_stack_fffffffffffff808._M_node >> 0x20));
          local_178 = 1;
        }
        else {
          CommsInterface::setTxStatus
                    (in_stack_fffffffffffff810,
                     (ConnectionStatus)((ulong)in_stack_fffffffffffff808._M_node >> 0x20));
          CommsInterface::setRxStatus
                    (in_stack_fffffffffffff810,
                     (ConnectionStatus)((ulong)in_stack_fffffffffffff808._M_node >> 0x20));
          local_178 = 1;
        }
      }
      else {
        if ((*(byte *)(in_RDI + 0x25c) & 1) == 0) {
          local_171 = (type)std::chrono::
                            operator<=><long,_std::ratio<1L,_1000L>,_long,_std::ratio<1L,_1000L>_>
                                      (in_stack_fffffffffffff828,
                                       (duration<long,_std::ratio<1L,_1000L>_> *)
                                       in_stack_fffffffffffff820);
          CLI::std::__cmp_cat::__unspec::__unspec(&local_172,(__unspec *)0x0);
          bVar2 = std::operator>(local_171);
          if (bVar2) {
            CommsInterface::setTxStatus
                      (in_stack_fffffffffffff810,
                       (ConnectionStatus)((ulong)in_stack_fffffffffffff808._M_node >> 0x20));
            CommsInterface::setRxStatus
                      (in_stack_fffffffffffff810,
                       (ConnectionStatus)((ulong)in_stack_fffffffffffff808._M_node >> 0x20));
            local_178 = 1;
            goto LAB_00399346;
          }
          local_184 = 200;
          std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>(local_180,&local_184)
          ;
          std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
                    ((duration<long,_std::ratio<1L,_1000L>_> *)in_stack_fffffffffffff840.values_);
          local_194 = 200;
          std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>(local_190,&local_194)
          ;
          std::chrono::duration<long,_std::ratio<1L,_1000L>_>::operator+=
                    ((duration<long,_std::ratio<1L,_1000L>_> *)in_stack_fffffffffffff800.__r,
                     (duration<long,_std::ratio<1L,_1000L>_> *)in_stack_fffffffffffff7f8);
        }
        else {
          local_160 = std::__cxx11::string::operator_cast_to_basic_string_view
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffff800.__r);
          local_170 = std::__cxx11::string::operator_cast_to_basic_string_view
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffff800.__r);
          sVar5 = (socklen_t)local_160._M_str;
          BrokerFactory::create
                    (in_stack_fffffffffffff91c,in_stack_fffffffffffff930,in_stack_fffffffffffff920);
          std::static_pointer_cast<helics::CoreBroker,helics::Broker>
                    ((shared_ptr<helics::Broker> *)in_stack_fffffffffffff808._M_node);
          iVar6 = (int)local_140;
          std::shared_ptr<helics::CoreBroker>::operator=
                    ((shared_ptr<helics::CoreBroker> *)in_stack_fffffffffffff800.__r,
                     (shared_ptr<helics::CoreBroker> *)in_stack_fffffffffffff7f8);
          std::shared_ptr<helics::CoreBroker>::~shared_ptr
                    ((shared_ptr<helics::CoreBroker> *)0x398f0d);
          std::shared_ptr<helics::Broker>::~shared_ptr((shared_ptr<helics::Broker> *)0x398f1a);
          peVar4 = std::
                   __shared_ptr_access<helics::CoreBroker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<helics::CoreBroker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x398f27);
          CoreBroker::connect(peVar4,iVar6,__addr,sVar5);
        }
LAB_0039933b:
        local_178 = 0;
      }
LAB_00399346:
      std::shared_ptr<helics::Broker>::~shared_ptr((shared_ptr<helics::Broker> *)0x399353);
    } while (local_178 == 0);
  }
  std::shared_ptr<helics::CoreBroker>::~shared_ptr((shared_ptr<helics::CoreBroker> *)0x39a413);
  return;
}

Assistant:

void InprocComms::queue_tx_function()
    {
        using std::chrono::milliseconds;
        // make sure the link to the localTargetAddress is in place
        if (name != localTargetAddress) {
            if (!brokerName.empty()) {
                if (!CoreFactory::copyCoreIdentifier(name, localTargetAddress)) {
                    if (!BrokerFactory::copyBrokerIdentifier(name, localTargetAddress)) {
                        setRxStatus(ConnectionStatus::ERRORED);
                        setTxStatus(ConnectionStatus::ERRORED);
                        return;
                    }
                }
            } else {
                if (!BrokerFactory::copyBrokerIdentifier(name, localTargetAddress)) {
                    setRxStatus(ConnectionStatus::ERRORED);
                    setTxStatus(ConnectionStatus::ERRORED);
                    return;
                }
            }
        }
        setRxStatus(ConnectionStatus::CONNECTED);
        std::shared_ptr<CoreBroker> tbroker;

        if (brokerName.empty()) {
            if (!brokerTargetAddress.empty()) {
                brokerName = brokerTargetAddress;
            }
        }

        if (!brokerName.empty()) {
            milliseconds totalSleep(0);
            int ecount{0};
            while (!tbroker) {
                auto broker = BrokerFactory::findBroker(brokerName);
                tbroker = std::dynamic_pointer_cast<CoreBroker>(broker);
                if (!tbroker) {
                    if (autoBroker) {
                        tbroker = std::static_pointer_cast<CoreBroker>(
                            BrokerFactory::create(CoreType::INPROC, brokerName, brokerInitString));
                        tbroker->connect();
                    } else {
                        if (totalSleep > connectionTimeout) {
                            setTxStatus(ConnectionStatus::ERRORED);
                            setRxStatus(ConnectionStatus::ERRORED);
                            return;
                        }
                        std::this_thread::sleep_for(milliseconds(200));
                        totalSleep += milliseconds(200);
                    }
                } else {
                    if (!tbroker->isOpenToNewFederates() && !observer) {
                        ++ecount;
                        if (ecount == 1) {
                            logError("broker is not open to new federates " + brokerName);
                        }
                        tbroker = nullptr;
                        broker = nullptr;
                        if (ecount >= 3) {
                            setTxStatus(ConnectionStatus::ERRORED);
                            setRxStatus(ConnectionStatus::ERRORED);
                            return;
                        }
                        if (ecount == 1) {
                            std::this_thread::sleep_for(milliseconds(200));
                        }
                        BrokerFactory::cleanUpBrokers(milliseconds(200));
                        totalSleep += milliseconds(200);
                        if (totalSleep > milliseconds(connectionTimeout)) {
                            setTxStatus(ConnectionStatus::ERRORED);
                            setRxStatus(ConnectionStatus::ERRORED);
                            return;
                        }
                    }
                }
            }
        } else if (!serverMode) {
            milliseconds totalSleep(0);
            while (!tbroker) {
                auto broker = BrokerFactory::findJoinableBrokerOfType(CoreType::INPROC);
                tbroker = std::dynamic_pointer_cast<CoreBroker>(broker);
                if (!tbroker) {
                    if (autoBroker) {
                        tbroker = std::static_pointer_cast<CoreBroker>(
                            BrokerFactory::create(CoreType::INPROC, "", brokerInitString));
                        tbroker->connect();
                    } else {
                        if (totalSleep > connectionTimeout) {
                            setTxStatus(ConnectionStatus::ERRORED);
                            setRxStatus(ConnectionStatus::ERRORED);
                            return;
                        }
                        std::this_thread::sleep_for(milliseconds(200));
                        totalSleep += milliseconds(200);
                    }
                }
            }
        }
        if (tbroker) {
            if (tbroker->getIdentifier() == localTargetAddress) {
                logError("broker == target");
            }
            if (!tbroker->isOpenToNewFederates() && !observer) {
                logError("broker is not open to new federates");
            }
        }

        setTxStatus(ConnectionStatus::CONNECTED);
        std::map<route_id, std::shared_ptr<BrokerBase>> routes;
        bool haltLoop{false};
        while (!haltLoop) {
            route_id rid;
            ActionMessage cmd;

            std::tie(rid, cmd) = txQueue.pop();
            bool processed = false;
            if (isProtocolCommand(cmd)) {
                if (rid == control_route) {
                    switch (cmd.messageID) {
                        case NEW_ROUTE: {
                            auto newroute = cmd.payload.to_string();
                            bool foundRoute = false;
                            auto core = CoreFactory::findCore(std::string(newroute));
                            if (core) {
                                auto tcore = std::dynamic_pointer_cast<CommonCore>(core);
                                if (tcore) {
                                    routes.emplace(route_id{cmd.getExtraData()}, std::move(tcore));
                                    foundRoute = true;
                                }
                            }
                            auto brk = BrokerFactory::findBroker(std::string(newroute));

                            if (brk) {
                                auto cbrk = std::dynamic_pointer_cast<CoreBroker>(brk);
                                if (cbrk) {
                                    routes.emplace(route_id{cmd.getExtraData()}, std::move(cbrk));
                                    foundRoute = true;
                                }
                            }
                            if (!foundRoute) {
                                logError(std::string("unable to establish Route to ") +
                                         std::string(newroute));
                            }
                            processed = true;
                        } break;
                        case REMOVE_ROUTE:
                            routes.erase(route_id{cmd.getExtraData()});
                            processed = true;
                            break;
                        case CLOSE_RECEIVER:
                            setRxStatus(ConnectionStatus::TERMINATED);
                            processed = true;
                            break;
                        case DISCONNECT:
                            haltLoop = true;
                            continue;
                    }
                }
            }
            if (processed) {
                continue;
            }

            if (rid == parent_route_id) {
                if (tbroker) {
                    tbroker->addActionMessage(std::move(cmd));
                } else {
                    logWarning(fmt::format(
                        "message directed to broker of comm system with no broker, message dropped {}",
                        prettyPrintString(cmd)));
                }
            } else {
                auto rt_find = routes.find(rid);
                if (rt_find != routes.end()) {
                    rt_find->second->addActionMessage(std::move(cmd));
                } else {
                    if (tbroker) {
                        tbroker->addActionMessage(std::move(cmd));
                    } else {
                        if (!isIgnoreableCommand(cmd)) {
                            logWarning(std::string("unknown route, message dropped ") +
                                       prettyPrintString(cmd));
                        }
                    }
                }
            }
        }  // while (!haltLoop)

        routes.clear();
        tbroker = nullptr;

        setTxStatus(ConnectionStatus::TERMINATED);
    }